

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::visitUnary
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermUnary *node)

{
  Builder *this_00;
  TSpirvInstruction *this_01;
  pointer *pppTVar1;
  bool bVar2;
  TOperator TVar3;
  TPrecisionQualifier TVar4;
  TIntermUnary *pTVar5;
  bool bVar6;
  undefined1 uVar7;
  int iVar8;
  int iVar9;
  Id IVar10;
  CoherentFlags CVar11;
  Decoration decoration;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  Op OVar15;
  Id IVar16;
  Id IVar17;
  TBasicType TVar18;
  Decoration DVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar20;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TType *pTVar21;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  SpvBuildLogger *pSVar22;
  TGlslangToSpvTraverser *pTVar23;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TQualifier *qualifier;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long *plVar24;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  long lVar25;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  uint uVar26;
  bool forwardReferenceOnly;
  bool forwardReferenceOnly_00;
  bool forwardReferenceOnly_01;
  bool forwardReferenceOnly_02;
  bool forwardReferenceOnly_03;
  bool forwardReferenceOnly_04;
  Op OVar27;
  char *filename;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literals_00;
  TPrecisionQualifier TVar28;
  ulong uVar29;
  TOperator op;
  undefined4 in_register_00000034;
  Op OVar30;
  uint uVar31;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  Id local_12c;
  TIntermUnary *node_local;
  undefined1 local_119;
  TOperator local_118;
  uint local_114;
  ulong local_110;
  Id invertedType;
  CoherentFlags lvalueCoherentFlags;
  OpDecorations decorations;
  anon_class_24_3_db054092 resultType;
  TVector<const_glslang::TIntermConstantUnion_*> constants;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  Function *local_78;
  Function *pFStack_70;
  CoherentFlags local_68 [2];
  ulong local_60;
  SpvBuildLogger *local_58;
  TIntermConstantUnion *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  ulong uVar32;
  
  this_00 = &this->builder;
  node_local = node;
  iVar8 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode)
                    (node,CONCAT44(in_register_00000034,param_1));
  iVar8 = *(int *)(CONCAT44(extraout_var,iVar8) + 0xc);
  iVar9 = (**(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
             _vptr_TIntermNode)();
  if (*(long *)CONCAT44(extraout_var_00,iVar9) == 0) {
    filename = (char *)0x0;
  }
  else {
    filename = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 8);
  }
  spv::Builder::setDebugSourceLocation(this_00,iVar8,filename);
  bVar2 = (this->builder).generatingOpCodeForSpecConst;
  iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x1e])();
  lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x58))
                     ((long *)CONCAT44(extraout_var_01,iVar8));
  if ((*(byte *)(lVar20 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  IVar10 = createImageTextureFunctionCall(this,&node_local->super_TIntermOperator);
  if (IVar10 == 0) {
    TVar3 = (node_local->super_TIntermOperator).op;
    if (TVar3 == EOpDeclare) {
      spv::Builder::clearAccessChain(this_00);
      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x10))
                ((long *)CONCAT44(extraout_var_05,iVar8),this);
      spv::Builder::clearAccessChain(this_00);
    }
    else {
      if (TVar3 == EOpArrayLength) {
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0xf0))
                           ((long *)CONCAT44(extraout_var_02,iVar8));
        uVar12 = *(uint *)(lVar20 + 8);
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        pTVar21 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0xf0))
                                     ((long *)CONCAT44(extraout_var_03,iVar8));
        if ((uVar12 & 0x600000) == 0) {
          uVar12 = *(uint *)&pTVar21->field_0x8;
          iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          lVar20 = *(long *)CONCAT44(extraout_var_13,iVar8);
          if ((uVar12 >> 0x1b & 1) == 0) {
            plVar24 = (long *)(**(code **)(lVar20 + 0x40))();
            plVar24 = (long *)(**(code **)(*plVar24 + 400))(plVar24);
            (**(code **)(*plVar24 + 0x10))(plVar24,this);
            iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x31])();
            plVar24 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_14,iVar8) + 0x40))
                                        ((long *)CONCAT44(extraout_var_14,iVar8));
            plVar24 = (long *)(**(code **)(*plVar24 + 0x198))(plVar24);
            lVar20 = (**(code **)(*plVar24 + 0x28))(plVar24);
            uVar12 = **(uint **)(*(long *)(lVar20 + 0xc0) + 8);
            IVar10 = spv::Builder::accessChainGetLValue(this_00);
            IVar10 = spv::Builder::createArrayLength(this_00,IVar10,uVar12);
          }
          else {
            pTVar21 = (TType *)(**(code **)(lVar20 + 0xf0))((long *)CONCAT44(extraout_var_13,iVar8))
            ;
            IVar10 = convertGlslangToSpvType(this,pTVar21,forwardReferenceOnly_02);
            IVar10 = spv::Builder::getCooperativeVectorNumComponents(this_00,IVar10);
          }
        }
        else {
          IVar10 = convertGlslangToSpvType(this,pTVar21,forwardReferenceOnly);
          OVar15 = (this->builder).module.idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[IVar10]->opCode;
          if ((OVar15 != OpTypeCooperativeMatrixKHR) && (OVar15 != OpTypeCooperativeMatrixNV)) {
            __assert_fail("builder.isCooperativeMatrixType(typeId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0xa30,
                          "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                         );
          }
          iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0xf0))
                             ((long *)CONCAT44(extraout_var_04,iVar8));
          if ((*(byte *)(lVar20 + 10) & 0x40) == 0) {
            (this->builder).generatingOpCodeForSpecConst = true;
            IVar10 = spv::Builder::createCooperativeMatrixLengthNV(this_00,IVar10);
          }
          else {
            IVar10 = spv::Builder::createCooperativeMatrixLengthKHR(this_00,IVar10);
          }
        }
        if (this->glslangIntermediate->source == EShSourceGlsl) {
          bVar6 = (this->builder).generatingOpCodeForSpecConst;
          IVar16 = spv::Builder::makeIntegerType(this_00,0x20,true);
          if (bVar6 == true) {
            IVar17 = spv::Builder::makeIntegerType(this_00,0x20,true);
            IVar17 = spv::Builder::makeIntConstant(this_00,IVar17,0,false);
            IVar10 = spv::Builder::createBinOp(this_00,OpIAdd,IVar16,IVar10,IVar17);
          }
          else {
            IVar10 = spv::Builder::createUnaryOp(this_00,OpBitcast,IVar16,IVar10);
          }
        }
        goto LAB_0043aa46;
      }
      resultType.invertedType = &invertedType;
      invertedType = 0;
      resultType.node = &node_local;
      IVar10 = invertedType;
      resultType.this = this;
      if (TVar3 == EOpInterpolateAtCentroid) {
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        plVar24 = (long *)CONCAT44(extraout_var_06,iVar8);
        lVar20 = (**(code **)(*plVar24 + 0x80))(plVar24);
        IVar10 = 0;
        if ((lVar20 != 0) &&
           (lVar20 = (**(code **)(*plVar24 + 0x80))(plVar24), *(int *)(lVar20 + 0xb8) == 0x36)) {
          plVar24 = (long *)(**(code **)(*plVar24 + 0xa0))(plVar24);
          plVar24 = (long *)(**(code **)(*plVar24 + 400))(plVar24);
          pTVar21 = (TType *)(**(code **)(*plVar24 + 0xf0))(plVar24);
          IVar10 = convertGlslangToSpvType(this,pTVar21,forwardReferenceOnly_00);
        }
      }
      invertedType = IVar10;
      spv::Builder::clearAccessChain(this_00);
      IVar10 = invertedType;
      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      pSVar22 = (SpvBuildLogger *)CONCAT44(extraout_var_07,iVar8);
      if (IVar10 != 0) {
        plVar24 = (long *)(*(code *)(pSVar22->tbdFeatures).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p)
                                    (pSVar22);
        pSVar22 = (SpvBuildLogger *)(**(code **)(*plVar24 + 400))(plVar24);
      }
      pTVar23 = this;
      (*(code *)(((pSVar22->tbdFeatures).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity)
                (pSVar22);
      op = (TOperator)pTVar23;
      lvalueCoherentFlags._0_2_ = lvalueCoherentFlags._0_2_ & 0xf800;
      TVar3 = (node_local->super_TIntermOperator).op;
      local_58 = pSVar22;
      if ((int)TVar3 < 0x262) {
        if (TVar3 - EOpAtomicCounterIncrement < 3) goto LAB_0043aced;
        if (TVar3 == EOpSpirvInst) {
          plVar24 = (long *)(**(code **)((long)&((pSVar22->tbdFeatures).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->field_2
                                        + 8))(pSVar22);
          lVar20 = (**(code **)(*plVar24 + 0x108))(plVar24);
          if ((*(byte *)(lVar20 + 0xf) & 8) == 0) goto LAB_0043acd5;
          goto LAB_0043aced;
        }
        if ((TVar3 == EOpInterpolateAtCentroid) &&
           (this->glslangIntermediate->source != EShSourceHlsl)) goto LAB_0043aced;
LAB_0043acd5:
        bVar6 = visitUnary::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(ulong)(node_local->super_TIntermOperator).op,
                           op);
        if (bVar6) goto LAB_0043aced;
        plVar24 = (long *)(**(code **)((long)&((pSVar22->tbdFeatures).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->field_2 +
                                      8))(pSVar22);
        lVar20 = (**(code **)(*plVar24 + 0x108))(plVar24);
        local_12c = 0;
        if ((*(byte *)(lVar20 + 0xf) & 0x10) == 0) {
          iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          pTVar21 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar8) + 0xf0))
                                       ((long *)CONCAT44(extraout_var_15,iVar8));
          local_12c = accessChainLoad(this,pTVar21);
        }
      }
      else {
        if ((0x13 < TVar3 - EOpRayQueryTerminate) ||
           ((0xc806dU >> (TVar3 - EOpRayQueryTerminate & 0x1f) & 1) == 0)) goto LAB_0043acd5;
LAB_0043aced:
        local_12c = spv::Builder::accessChainGetLValue(this_00);
        constants.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Tp_alloc_type.allocator._0_4_ = (this->builder).accessChain.base;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &constants.
                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    .
                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    ._M_impl.super__Vector_impl_data,&(this->builder).accessChain.indexChain);
        pTVar21 = (TType *)&(this->builder).accessChain.swizzle;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_90,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar21);
        local_78 = *(Function **)&(this->builder).accessChain.component;
        pFStack_70 = *(Function **)&(this->builder).accessChain.isRValue;
        lvalueCoherentFlags._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
        local_68[0]._0_2_ = lvalueCoherentFlags._0_2_;
        if ((pointer)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pTVar21 = (TType *)((long)local_90.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_90.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
          operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,(ulong)pTVar21);
        }
        if (constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pTVar21 = (TType *)((long)constants.
                                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    .
                                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)constants.
                                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                   .
                                   super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(constants.
                          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          .
                          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)pTVar21);
        }
        plVar24 = (long *)(**(code **)((long)&((pSVar22->tbdFeatures).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->field_2 +
                                      8))(pSVar22);
        pTVar23 = (TGlslangToSpvTraverser *)(**(code **)(*plVar24 + 0xf0))(plVar24);
        CVar11 = TranslateCoherent(pTVar23,pTVar21);
        constants.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Tp_alloc_type.allocator._0_2_ = CVar11._0_2_;
        spv::Builder::AccessChain::CoherentFlags::operator|=
                  (&lvalueCoherentFlags,(CoherentFlags *)&constants);
      }
      TVar4 = (node_local->super_TIntermOperator).operationPrecision;
      TVar28 = *(uint *)&(node_local->super_TIntermOperator).super_TIntermTyped.type.qualifier.
                         field_0x8 >> 0x19 & 7;
      if (TVar4 != EpqNone) {
        TVar28 = TVar4;
      }
      local_114 = 0;
      DVar19 = DecorationMax;
      if (TVar28 - EpqLow < 2) {
        DVar19 = DecorationRelaxedPrecision;
      }
      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar8) + 0x58))
                         ((long *)CONCAT44(extraout_var_08,iVar8));
      decorations.noContraction = DecorationNoContraction;
      if ((*(ulong *)(lVar20 + 8) >> 0x24 & 1) == 0) {
        decorations.noContraction = DecorationMax;
      }
      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      qualifier = (TQualifier *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar8) + 0x58))
                            ((long *)CONCAT44(extraout_var_09,iVar8));
      decoration = TranslateNonUniformDecoration(this,qualifier);
      local_118 = (node_local->super_TIntermOperator).op;
      uVar12 = invertedType;
      decorations.precision = DVar19;
      decorations.nonUniform = decoration;
      if (invertedType == 0) {
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        uVar12 = convertGlslangToSpvType
                           (this,(TType *)CONCAT44(extraout_var_10,iVar8),forwardReferenceOnly_01);
      }
      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar8) + 0x38))
                        ((long *)CONCAT44(extraout_var_11,iVar8));
      iVar9 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      uVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0x100))
                         ((long *)CONCAT44(extraout_var_12,iVar9));
      uVar29 = (ulong)uVar13;
      if ((this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12]->opCode == OpTypeVector) {
        local_114 = spv::Builder::getNumTypeConstituents(this_00,uVar12);
      }
      IVar10 = local_12c;
      if (local_118 == EOpConvNumeric) {
        uVar14 = uVar13 - 4;
        uVar31 = iVar8 - 1;
        uVar32 = (ulong)uVar31;
        OVar15 = OpConvertSToF;
        if ((uVar14 & 0xfffffff9) != 0) {
          OVar15 = OpNop;
        }
        if (2 < uVar31) {
          OVar15 = OpNop;
        }
        uVar26 = uVar13 - 5;
        OVar27 = OpConvertUToF;
        if ((uVar26 & 0xfffffff9) != 0) {
          OVar27 = OVar15;
        }
        if (2 < uVar31) {
          OVar27 = OVar15;
        }
        uVar35 = uVar13 - 1;
        uVar33 = iVar8 - 4;
        OVar15 = OpConvertFToS;
        if (2 < uVar35) {
          OVar15 = OVar27;
        }
        if ((uVar33 & 0xfffffff9) != 0) {
          OVar15 = OVar27;
        }
        uVar34 = iVar8 - 5;
        OVar30 = OpConvertFToU;
        if ((uVar34 & 0xfffffff9) != 0) {
          OVar30 = OVar15;
        }
        if (2 < uVar35) {
          OVar30 = OVar27;
        }
        OVar27 = OpSConvert;
        if (((uVar14 | uVar33) & 0xfffffff9) != 0) {
          OVar27 = OVar30;
        }
        OVar15 = OpUConvert;
        if (((uVar26 | uVar34) & 0xfffffff9) != 0) {
          OVar15 = OVar27;
        }
        local_110 = uVar29;
        if (((2 < uVar31) || (2 < uVar35)) ||
           (OVar15 = OpFConvert,
           (this->builder).module.idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12]->opCode != OpTypeMatrix)) {
          bVar6 = (uVar26 & 0xfffffff9) == 0;
          bVar36 = (uVar14 & 0xfffffff9) == 0;
          local_119 = bVar36 || bVar6;
          if (bVar36 || bVar6) {
            bVar6 = (uVar34 & 0xfffffff9) == 0;
            if (((uVar33 & 0xfffffff9) == 0 || bVar6) && (bVar6 != ((uVar26 & 0xfffffff9) == 0))) {
              if ((10 < uVar35) || (10 < uVar31)) goto LAB_0043bfda;
              if (*(int *)(&DAT_00867aa8 + (ulong)uVar35 * 4) !=
                  *(int *)(&DAT_00867aa8 + (ulong)uVar31 * 4)) {
                local_60 = uVar32;
                if (10 < uVar31) goto LAB_0043bfda;
                bVar6 = (uVar14 & 0xfffffff9) == 0;
                IVar10 = spv::Builder::makeIntegerType
                                   (this_00,*(int *)(&DAT_00867aa8 + (ulong)uVar31 * 4),bVar6);
                OVar15 = (this->builder).module.idToInstruction.
                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12]->opCode;
                if (OVar15 == OpTypeCooperativeVectorNV) {
                  IVar16 = spv::Builder::getCooperativeVectorNumComponents(this_00,uVar12);
                  IVar10 = spv::Builder::makeCooperativeVectorTypeNV(this_00,IVar10,IVar16);
                }
                else if ((int)local_114 < 1) {
                  if ((OVar15 == OpTypeCooperativeMatrixNV) ||
                     (OVar15 == OpTypeCooperativeMatrixKHR)) {
                    IVar10 = spv::Builder::makeCooperativeMatrixTypeWithSameShape
                                       (this_00,IVar10,uVar12);
                  }
                }
                else {
                  IVar10 = spv::Builder::makeVectorType(this_00,IVar10,local_114);
                }
                IVar10 = spv::Builder::createUnaryOp(this_00,bVar6 + OpUConvert,IVar10,local_12c);
                uVar32 = local_60;
              }
              OVar15 = OpBitcast;
              if ((this->builder).generatingOpCodeForSpecConst == true) {
                if ((uint)uVar32 < 0xb) {
                  uVar7 = (*(code *)(&DAT_0086562c + *(int *)(&DAT_0086562c + uVar32 * 4)))();
                  return (bool)uVar7;
                }
                goto LAB_0043bfda;
              }
            }
          }
          if (iVar8 == 0xc) {
            if (uVar35 < 0xb) {
              uVar7 = (*(code *)(&DAT_00865600 + *(int *)(&DAT_00865600 + (ulong)uVar35 * 4)))();
              return (bool)uVar7;
            }
LAB_0043bfda:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/../Include/BaseTypes.h"
                          ,0x276,"uint32_t glslang::GetNumBits(TBasicType)");
          }
          if (uVar13 == 0xc) {
            if ((uint)uVar32 < 0xb) {
              uVar7 = (*(code *)(&DAT_008655d4 + *(int *)(&DAT_008655d4 + uVar32 * 4)))();
              return (bool)uVar7;
            }
            goto LAB_0043bfda;
          }
          goto LAB_0043aff4;
        }
        OVar15 = createUnaryMatrixOperation
                           (this,OpFConvert,&decorations,uVar12,local_12c,EbtReference);
      }
      else {
        OVar15 = OpNop;
LAB_0043aff4:
        uVar13 = local_114;
        if (OVar15 == OpNop) {
          OVar15 = OpNop;
          if (local_118 - EOpConvUint64ToPtr < 4) {
            OVar15 = *(Op *)(&DAT_008654c0 + (ulong)(local_118 - EOpConvUint64ToPtr) * 4);
          }
        }
        if (OVar15 != OpNop) {
          if (OVar15 == OpSelect) {
            local_110 = CONCAT44(local_110._4_4_,IVar10);
            local_118 = makeSmearedConstant(this,0,local_114);
            IVar10 = makeSmearedConstant(this,0,uVar13);
            OVar15 = spv::Builder::createTriOp
                               (this_00,OpSelect,uVar12,(Id)local_110,IVar10,local_118);
          }
          else {
            OVar15 = spv::Builder::createUnaryOp(this_00,OVar15,uVar12,IVar10);
          }
          if ((TVar28 - EpqLow < 2) && (OVar15 != OpNop)) {
            spv::Builder::addDecoration(this_00,OVar15,DVar19,-1);
          }
          spv::Builder::addDecoration(this_00,OVar15,decoration,-1);
        }
      }
      if (OVar15 == OpNop) {
        OVar15 = OpNop;
      }
      else {
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        if ((*(byte *)(CONCAT44(extraout_var_16,iVar8) + 10) & 0x40) != 0) {
          iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          plVar24 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar8) + 0x18))
                                      ((long *)CONCAT44(extraout_var_17,iVar8));
          lVar20 = (**(code **)(*plVar24 + 0xf0))(plVar24);
          if ((*(byte *)(lVar20 + 10) & 0x40) != 0) {
            iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[3])();
            lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar8) + 0xf0))
                               ((long *)CONCAT44(extraout_var_18,iVar8));
            iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x31])();
            plVar24 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_19,iVar8) + 0x18))
                                        ((long *)CONCAT44(extraout_var_19,iVar8));
            lVar25 = (**(code **)(*plVar24 + 0xf0))(plVar24);
            if (((*(uint *)(lVar25 + 8) ^ *(uint *)(lVar20 + 8)) & 0x3800000) != 0) {
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator._0_4_ = 0x1537;
              std::
              _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              ::_M_insert_unique<spv::Capability_const&>
                        ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                          *)&(this->builder).capabilities,(Capability *)&constants);
              spv::Builder::addExtension(this_00,"SPV_NV_cooperative_matrix2");
            }
          }
        }
      }
      pTVar23 = resultType.this;
      if (OVar15 == OpNop) {
        TVar3 = (node_local->super_TIntermOperator).op;
        IVar10 = *resultType.invertedType;
        if (IVar10 == 0) {
          iVar8 = (*((*resultType.node)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode
                    ._vptr_TIntermNode[0x1e])();
          IVar10 = convertGlslangToSpvType
                             (pTVar23,(TType *)CONCAT44(extraout_var_20,iVar8),
                              forwardReferenceOnly_03);
        }
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        TVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar8) + 0x100))
                           ((long *)CONCAT44(extraout_var_21,iVar8));
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        OVar15 = createUnaryOperation
                           (this,TVar3,&decorations,IVar10,local_12c,TVar18,&lvalueCoherentFlags,
                            (TType *)CONCAT44(extraout_var_22,iVar8));
      }
      pTVar5 = node_local;
      if ((OVar15 == OpNop) &&
         (OVar15 = OpNop, (node_local->super_TIntermOperator).op == EOpSpirvInst)) {
        this_01 = &node_local->spirvInst;
        iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (&this_01->set,"");
        pSVar22 = local_58;
        if (iVar8 == 0) {
          plVar24 = (long *)(**(code **)((long)&((local_58->tbdFeatures).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->field_2
                                        + 8))(local_58);
          lVar20 = (**(code **)(*plVar24 + 0x108))(plVar24);
          bVar6 = (*(byte *)(lVar20 + 0xf) & 0x10) == 0;
          uVar12 = local_12c;
          if (!bVar6) {
            literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator = glslang::GetThreadPoolAllocator();
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_50 = (TIntermConstantUnion *)
                       (*(code *)(pSVar22->tbdFeatures).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length)
                                 (pSVar22);
            std::
            vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
            ::emplace_back<glslang::TIntermConstantUnion_const*>
                      ((vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
                        *)&constants,&local_50);
            TranslateLiterals((TGlslangToSpvTraverser *)&constants,
                              (TVector<const_glslang::TIntermConstantUnion_*> *)&literals,
                              literals_00);
            uVar12 = *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            operator_delete(literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)literals.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)literals.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar29 = (ulong)bVar6;
          iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x20])();
          OVar15 = (pTVar5->spirvInst).id;
          if (iVar8 != 0) {
            local_118 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)operator_new(8);
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&(constants.
                            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            .
                            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            ._M_impl.super__Tp_alloc_type.allocator)->alignment;
            (constants.
             super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
             .
             super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
             ._M_impl.super__Tp_alloc_type.allocator)->pageSize = (ulong)uVar12 << 0x20 | uVar29;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 constants.
                 super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                 .
                 super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            OVar15 = spv::Builder::createOp
                               (this_00,OVar15,local_118,
                                (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                                &constants);
            goto LAB_0043ba8c;
          }
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)operator_new(8);
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&(constants.
                          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          .
                          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          ._M_impl.super__Tp_alloc_type.allocator)->alignment;
          (constants.
           super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
           .
           super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
           ._M_impl.super__Tp_alloc_type.allocator)->pageSize = (ulong)uVar12 << 0x20 | uVar29;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               constants.
               super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               .
               super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
          spv::Builder::createNoResultOp
                    (this_00,OVar15,
                     (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&constants);
          if (constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
            operator_delete(constants.
                            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            .
                            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            ._M_impl.super__Tp_alloc_type.allocator,
                            (long)constants.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)constants.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Tp_alloc_type.allocator);
          }
          OVar15 = OpNop;
        }
        else {
          IVar10 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
          iVar8 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&this_01->set,"GLSL.std.450");
          if (iVar8 == 0) {
            IVar16 = this->stdBuiltins;
          }
          else {
            IVar16 = getExtBuiltins(this,(pTVar5->spirvInst).set._M_dataplus._M_p);
          }
          iVar8 = (pTVar5->spirvInst).id;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)operator_new(4);
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)&(constants.
                                 super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                 .
                                 super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                 ._M_impl.super__Tp_alloc_type.allocator)->pageSize + 4);
          *(Id *)&(constants.
                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   .
                   super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   ._M_impl.super__Tp_alloc_type.allocator)->pageSize = local_12c;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               constants.
               super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               .
               super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
          OVar15 = spv::Builder::createBuiltinCall
                             (this_00,IVar10,IVar16,iVar8,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
LAB_0043ba8c:
          if (constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
            operator_delete(constants.
                            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            .
                            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            ._M_impl.super__Tp_alloc_type.allocator,
                            (long)constants.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)constants.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Tp_alloc_type.allocator);
          }
        }
        iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x20])();
        if (iVar8 == 0) {
          bVar6 = false;
          goto LAB_0043aa5d;
        }
      }
      DVar19 = decorations.precision;
      if (OVar15 == OpNop) {
        TVar3 = (node_local->super_TIntermOperator).op;
        if ((int)TVar3 < 0x157) {
          if ((int)TVar3 < 0xaf) {
            if (3 < TVar3 - EOpPostIncrement) {
LAB_0043bdb2:
              pSVar22 = this->logger;
              pppTVar1 = &constants.
                          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          .
                          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)pppTVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&constants,"unknown glslang unary","");
              spv::SpvBuildLogger::missingFunctionality(pSVar22,(string *)&constants);
              if (constants.
                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  .
                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)pppTVar1) {
                operator_delete(constants.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator,
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
              bVar6 = true;
              goto LAB_0043aa5d;
            }
            iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x20])();
            if (iVar8 == 1) {
              IVar10 = spv::Builder::makeFloatConstant(this_00,1.0,false);
            }
            else {
              iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x20])();
              if (iVar8 == 2) {
                IVar10 = spv::Builder::makeDoubleConstant(this_00,1.0,false);
              }
              else {
                iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x20])();
                if (iVar8 == 3) {
                  IVar10 = spv::Builder::makeFloat16Constant(this_00,1.0,false);
                }
                else {
                  iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode
                            ._vptr_TIntermNode[0x20])();
                  if ((iVar8 == 4) ||
                     (iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                super_TIntermNode._vptr_TIntermNode[0x20])(), iVar8 == 5)) {
                    IVar10 = spv::Builder::makeInt8Constant(this_00,1,false);
                  }
                  else {
                    iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                              super_TIntermNode._vptr_TIntermNode[0x20])();
                    if ((iVar8 == 6) ||
                       (iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                  super_TIntermNode._vptr_TIntermNode[0x20])(), iVar8 == 7)) {
                      IVar10 = spv::Builder::makeInt16Constant(this_00,1,false);
                    }
                    else {
                      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                super_TIntermNode._vptr_TIntermNode[0x20])();
                      if ((iVar8 == 10) ||
                         (iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                    super_TIntermNode._vptr_TIntermNode[0x20])(), iVar8 == 0xb)) {
                        IVar10 = spv::Builder::makeInt64Constant(this_00,1,false);
                      }
                      else {
                        IVar10 = spv::Builder::makeIntConstant(this_00,1,false);
                      }
                    }
                  }
                }
              }
            }
            TVar3 = (node_local->super_TIntermOperator).op;
            iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            IVar16 = convertGlslangToSpvType
                               (this,(TType *)CONCAT44(extraout_var_24,iVar8),
                                forwardReferenceOnly_04);
            iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            TVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar8) + 0x38))
                               ((long *)CONCAT44(extraout_var_25,iVar8));
            IVar10 = createBinaryOperation
                               (this,((TVar3 & ~EOpScope) != EOpPostIncrement) + EOpAdd,&decorations
                                ,IVar16,local_12c,IVar10,TVar18,true);
            if (IVar10 == 0) {
              __assert_fail("result != spv::NoResult",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0xb10,
                            "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                           );
            }
            spv::Builder::getAccessChain((AccessChain *)&constants,this_00);
            DVar19 = TranslateNonUniformDecoration(this,local_68);
            spv::Builder::accessChainStore(this_00,IVar10,DVar19,MaskNone,Max,0);
            spv::Builder::AccessChain::~AccessChain((AccessChain *)&constants);
            spv::Builder::clearAccessChain(this_00);
            TVar3 = (node_local->super_TIntermOperator).op;
            (this->builder).accessChain.isRValue = true;
            if ((TVar3 & ~EOpSequence) == EOpPreIncrement) goto LAB_0043aa55;
            (this->builder).accessChain.base = local_12c;
            goto LAB_0043aa5b;
          }
          if (TVar3 == EOpEmitStreamVertex) {
            OVar15 = OpEmitStreamVertex;
          }
          else {
            if (TVar3 != EOpEndStreamPrimitive) {
              if (TVar3 == EOpCreateTensorLayoutNV) {
                IVar10 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
                OVar15 = OpCreateTensorLayoutNV;
                goto LAB_0043bd5b;
              }
              goto LAB_0043bdb2;
            }
            OVar15 = OpEndStreamPrimitive;
          }
        }
        else if ((int)TVar3 < 0x280) {
          if (TVar3 == EOpCreateTensorViewNV) {
            IVar10 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
            OVar15 = OpCreateTensorViewNV;
LAB_0043bd5b:
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
            IVar10 = spv::Builder::createOp
                               (this_00,OVar15,IVar10,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
            if (constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
              operator_delete(constants.
                              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                              .
                              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                              ._M_impl.super__Tp_alloc_type.allocator,
                              (long)constants.
                                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    .
                                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)constants.
                                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    .
                                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    ._M_impl.super__Tp_alloc_type.allocator);
            }
            goto LAB_0043aa46;
          }
          if (TVar3 == EOpRayQueryTerminate) {
            OVar15 = OpRayQueryTerminateKHR;
          }
          else {
            if (TVar3 != EOpRayQueryConfirmIntersection) goto LAB_0043bdb2;
            OVar15 = OpRayQueryConfirmIntersectionKHR;
          }
        }
        else if (TVar3 == EOpHitObjectRecordEmptyNV) {
          OVar15 = OpHitObjectRecordEmptyNV;
        }
        else if (TVar3 == EOpReorderThreadNV) {
          OVar15 = OpReorderThreadWithHitObjectNV;
        }
        else {
          if (TVar3 != EOpAssumeEXT) goto LAB_0043bdb2;
          constants.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator._0_4_ = 0x15fd;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&(this->builder).capabilities,(Capability *)&constants);
          spv::Builder::addExtension(this_00,"SPV_KHR_expect_assume");
          OVar15 = OpAssumeTrueKHR;
        }
        spv::Builder::createNoResultOp(this_00,OVar15,local_12c);
      }
      else {
        if (invertedType != 0) {
          iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          OVar15 = createInvertedSwizzle
                             (this,DVar19,(TIntermTyped *)CONCAT44(extraout_var_23,iVar8),OVar15);
          spv::Builder::addDecoration(this_00,OVar15,decorations.nonUniform,-1);
        }
        spv::Builder::clearAccessChain(this_00);
        (this->builder).accessChain.isRValue = true;
        (this->builder).accessChain.base = OVar15;
      }
    }
  }
  else {
LAB_0043aa46:
    spv::Builder::clearAccessChain(this_00);
    (this->builder).accessChain.isRValue = true;
LAB_0043aa55:
    (this->builder).accessChain.base = IVar10;
  }
LAB_0043aa5b:
  bVar6 = false;
LAB_0043aa5d:
  (this->builder).generatingOpCodeForSpecConst = bVar2;
  return bVar6;
}

Assistant:

bool TGlslangToSpvTraverser::visitUnary(glslang::TVisit /* visit */, glslang::TIntermUnary* node)
{
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (node->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();

    spv::Id result = spv::NoResult;

    // try texturing first
    result = createImageTextureFunctionCall(node);
    if (result != spv::NoResult) {
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // Non-texturing.

    if (node->getOp() == glslang::EOpArrayLength) {
        // Quite special; won't want to evaluate the operand.

        // Currently, the front-end does not allow .length() on an array until it is sized,
        // except for the last block membeor of an SSBO.
        // TODO: If this changes, link-time sized arrays might show up here, and need their
        // size extracted.

        // Normal .length() would have been constant folded by the front-end.
        // So, this has to be block.lastMember.length().
        // SPV wants "block" and member number as the operands, go get them.

        spv::Id length;
        if (node->getOperand()->getType().isCoopMat()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            assert(builder.isCooperativeMatrixType(typeId));

            if (node->getOperand()->getType().isCoopMatKHR()) {
                length = builder.createCooperativeMatrixLengthKHR(typeId);
            } else {
                spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
                length = builder.createCooperativeMatrixLengthNV(typeId);
            }
        } else if (node->getOperand()->getType().isCoopVecNV()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            length = builder.getCooperativeVectorNumComponents(typeId);
        } else {
            glslang::TIntermTyped* block = node->getOperand()->getAsBinaryNode()->getLeft();
            block->traverse(this);
            unsigned int member = node->getOperand()->getAsBinaryNode()->getRight()->getAsConstantUnion()
                ->getConstArray()[0].getUConst();
            length = builder.createArrayLength(builder.accessChainGetLValue(), member);
        }

        // GLSL semantics say the result of .length() is an int, while SPIR-V says
        // signedness must be 0. So, convert from SPIR-V unsigned back to GLSL's
        // AST expectation of a signed result.
        if (glslangIntermediate->getSource() == glslang::EShSourceGlsl) {
            if (builder.isInSpecConstCodeGenMode()) {
                length = builder.createBinOp(spv::OpIAdd, builder.makeIntType(32), length, builder.makeIntConstant(0));
            } else {
                length = builder.createUnaryOp(spv::OpBitcast, builder.makeIntType(32), length);
            }
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(length);

        return false;
    }

    // Force variable declaration - Debug Mode Only
    if (node->getOp() == glslang::EOpDeclare) {
        builder.clearAccessChain();
        node->getOperand()->traverse(this);
        builder.clearAccessChain();
        return false;
    }

    // Start by evaluating the operand

    // Does it need a swizzle inversion?  If so, evaluation is inverted;
    // operate first on the swizzle base, then apply the swizzle.
    spv::Id invertedType = spv::NoType;
    auto resultType = [&invertedType, &node, this](){ return invertedType != spv::NoType ?
        invertedType : convertGlslangToSpvType(node->getType()); };
    if (node->getOp() == glslang::EOpInterpolateAtCentroid)
        invertedType = getInvertedSwizzleType(*node->getOperand());

    builder.clearAccessChain();
    TIntermNode *operandNode;
    if (invertedType != spv::NoType)
        operandNode = node->getOperand()->getAsBinaryNode()->getLeft();
    else
        operandNode = node->getOperand();

    operandNode->traverse(this);

    spv::Id operand = spv::NoResult;

    spv::Builder::AccessChain::CoherentFlags lvalueCoherentFlags;

    const auto hitObjectOpsWithLvalue = [](glslang::TOperator op) {
        switch(op) {
            case glslang::EOpReorderThreadNV:
            case glslang::EOpHitObjectGetCurrentTimeNV:
            case glslang::EOpHitObjectGetHitKindNV:
            case glslang::EOpHitObjectGetPrimitiveIndexNV:
            case glslang::EOpHitObjectGetGeometryIndexNV:
            case glslang::EOpHitObjectGetInstanceIdNV:
            case glslang::EOpHitObjectGetInstanceCustomIndexNV:
            case glslang::EOpHitObjectGetObjectRayDirectionNV:
            case glslang::EOpHitObjectGetObjectRayOriginNV:
            case glslang::EOpHitObjectGetWorldRayDirectionNV:
            case glslang::EOpHitObjectGetWorldRayOriginNV:
            case glslang::EOpHitObjectGetWorldToObjectNV:
            case glslang::EOpHitObjectGetObjectToWorldNV:
            case glslang::EOpHitObjectGetRayTMaxNV:
            case glslang::EOpHitObjectGetRayTMinNV:
            case glslang::EOpHitObjectIsEmptyNV:
            case glslang::EOpHitObjectIsHitNV:
            case glslang::EOpHitObjectIsMissNV:
            case glslang::EOpHitObjectRecordEmptyNV:
            case glslang::EOpHitObjectGetShaderBindingTableRecordIndexNV:
            case glslang::EOpHitObjectGetShaderRecordBufferHandleNV:
            case glslang::EOpHitObjectGetClusterIdNV:
            case glslang::EOpHitObjectGetSpherePositionNV:
            case glslang::EOpHitObjectGetSphereRadiusNV:
            case glslang::EOpHitObjectIsSphereHitNV:
            case glslang::EOpHitObjectIsLSSHitNV:
                return true;
            default:
                return false;
        }
    };

    if (node->getOp() == glslang::EOpAtomicCounterIncrement ||
        node->getOp() == glslang::EOpAtomicCounterDecrement ||
        node->getOp() == glslang::EOpAtomicCounter          ||
        (node->getOp() == glslang::EOpInterpolateAtCentroid &&
          glslangIntermediate->getSource() != glslang::EShSourceHlsl)  ||
        node->getOp() == glslang::EOpRayQueryProceed        ||
        node->getOp() == glslang::EOpRayQueryGetRayTMin     ||
        node->getOp() == glslang::EOpRayQueryGetRayFlags    ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayOrigin ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayDirection ||
        node->getOp() == glslang::EOpRayQueryGetIntersectionCandidateAABBOpaque ||
        node->getOp() == glslang::EOpRayQueryTerminate ||
        node->getOp() == glslang::EOpRayQueryConfirmIntersection ||
        (node->getOp() == glslang::EOpSpirvInst && operandNode->getAsTyped()->getQualifier().isSpirvByReference()) ||
        hitObjectOpsWithLvalue(node->getOp())) {
        operand = builder.accessChainGetLValue(); // Special case l-value operands
        lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
        lvalueCoherentFlags |= TranslateCoherent(operandNode->getAsTyped()->getType());
    } else if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
        // Will be translated to a literal value, make a placeholder here
        operand = spv::NoResult;
    } else {
        operand = accessChainLoad(node->getOperand()->getType());
    }

    OpDecorations decorations = { TranslatePrecisionDecoration(node->getOperationPrecision()),
                                  TranslateNoContractionDecoration(node->getType().getQualifier()),
                                  TranslateNonUniformDecoration(node->getType().getQualifier()) };

    // it could be a conversion
    if (! result) {
        result = createConversion(node->getOp(), decorations, resultType(), operand,
            node->getType().getBasicType(), node->getOperand()->getBasicType());
        if (result) {
            if (node->getType().isCoopMatKHR() && node->getOperand()->getAsTyped()->getType().isCoopMatKHR() &&
                !node->getAsTyped()->getType().sameCoopMatUse(node->getOperand()->getAsTyped()->getType())) {
                // Conversions that change use need CapabilityCooperativeMatrixConversionsNV
                builder.addCapability(spv::CapabilityCooperativeMatrixConversionsNV);
                builder.addExtension(spv::E_SPV_NV_cooperative_matrix2);
            }
        }
    }

    // if not, then possibly an operation
    if (! result)
        result = createUnaryOperation(node->getOp(), decorations, resultType(), operand,
            node->getOperand()->getBasicType(), lvalueCoherentFlags, node->getType());

    // it could be attached to a SPIR-V intruction
    if (!result) {
        if (node->getOp() == glslang::EOpSpirvInst) {
            const auto& spirvInst = node->getSpirvInstruction();
            if (spirvInst.set == "") {
                spv::IdImmediate idImmOp = {true, operand};
                if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
                    // Translate the constant to a literal value
                    std::vector<unsigned> literals;
                    glslang::TVector<const glslang::TIntermConstantUnion*> constants;
                    constants.push_back(operandNode->getAsConstantUnion());
                    TranslateLiterals(constants, literals);
                    idImmOp = {false, literals[0]};
                }

                if (node->getBasicType() == glslang::EbtVoid)
                    builder.createNoResultOp(static_cast<spv::Op>(spirvInst.id), {idImmOp});
                else
                    result = builder.createOp(static_cast<spv::Op>(spirvInst.id), resultType(), {idImmOp});
            } else {
                result = builder.createBuiltinCall(
                    resultType(), spirvInst.set == "GLSL.std.450" ? stdBuiltins : getExtBuiltins(spirvInst.set.c_str()),
                    spirvInst.id, {operand});
            }

            if (node->getBasicType() == glslang::EbtVoid)
                return false; // done with this node
        }
    }

    if (result) {
        if (invertedType) {
            result = createInvertedSwizzle(decorations.precision, *node->getOperand(), result);
            decorations.addNonUniform(builder, result);
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // it must be a special case, check...
    switch (node->getOp()) {
    case glslang::EOpPostIncrement:
    case glslang::EOpPostDecrement:
    case glslang::EOpPreIncrement:
    case glslang::EOpPreDecrement:
        {
            // we need the integer value "1" or the floating point "1.0" to add/subtract
            spv::Id one = 0;
            if (node->getBasicType() == glslang::EbtFloat)
                one = builder.makeFloatConstant(1.0F);
            else if (node->getBasicType() == glslang::EbtDouble)
                one = builder.makeDoubleConstant(1.0);
            else if (node->getBasicType() == glslang::EbtFloat16)
                one = builder.makeFloat16Constant(1.0F);
            else if (node->getBasicType() == glslang::EbtInt8  || node->getBasicType() == glslang::EbtUint8)
                one = builder.makeInt8Constant(1);
            else if (node->getBasicType() == glslang::EbtInt16 || node->getBasicType() == glslang::EbtUint16)
                one = builder.makeInt16Constant(1);
            else if (node->getBasicType() == glslang::EbtInt64 || node->getBasicType() == glslang::EbtUint64)
                one = builder.makeInt64Constant(1);
            else
                one = builder.makeIntConstant(1);
            glslang::TOperator op;
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPostIncrement)
                op = glslang::EOpAdd;
            else
                op = glslang::EOpSub;

            spv::Id result = createBinaryOperation(op, decorations,
                                                   convertGlslangToSpvType(node->getType()), operand, one,
                                                   node->getType().getBasicType());
            assert(result != spv::NoResult);

            // The result of operation is always stored, but conditionally the
            // consumed result.  The consumed result is always an r-value.
            builder.accessChainStore(result,
                                     TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags));
            builder.clearAccessChain();
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPreDecrement)
                builder.setAccessChainRValue(result);
            else
                builder.setAccessChainRValue(operand);
        }

        return false;

    case glslang::EOpAssumeEXT:
        builder.addCapability(spv::CapabilityExpectAssumeKHR);
        builder.addExtension(spv::E_SPV_KHR_expect_assume);
        builder.createNoResultOp(spv::OpAssumeTrueKHR, operand);
        return false;
    case glslang::EOpEmitStreamVertex:
        builder.createNoResultOp(spv::OpEmitStreamVertex, operand);
        return false;
    case glslang::EOpEndStreamPrimitive:
        builder.createNoResultOp(spv::OpEndStreamPrimitive, operand);
        return false;
    case glslang::EOpRayQueryTerminate:
        builder.createNoResultOp(spv::OpRayQueryTerminateKHR, operand);
        return false;
    case glslang::EOpRayQueryConfirmIntersection:
        builder.createNoResultOp(spv::OpRayQueryConfirmIntersectionKHR, operand);
        return false;
    case glslang::EOpReorderThreadNV:
        builder.createNoResultOp(spv::OpReorderThreadWithHitObjectNV, operand);
        return false;
    case glslang::EOpHitObjectRecordEmptyNV:
        builder.createNoResultOp(spv::OpHitObjectRecordEmptyNV, operand);
        return false;

    case glslang::EOpCreateTensorLayoutNV:
        result = builder.createOp(spv::OpCreateTensorLayoutNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    case glslang::EOpCreateTensorViewNV:
        result = builder.createOp(spv::OpCreateTensorViewNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    default:
        logger->missingFunctionality("unknown glslang unary");
        return true;  // pick up operand as placeholder result
    }
}